

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

void __thiscall musicBlock::OPLpitchWheel(musicBlock *this,uint channel,int pitch)

{
  channelEntry *pcVar1;
  int iVar2;
  channelEntry *ch;
  uint id;
  uint i;
  int pitch_local;
  uint channel_local;
  musicBlock *this_local;
  
  iVar2 = (int)((pitch + -0x2000) * (uint)(this->driverdata).channelPitchSens[channel]) / 0x6400 +
          0x40;
  (this->driverdata).channelPitch[channel] = (schar)iVar2;
  for (ch._4_4_ = 0; ch._4_4_ < this->io->OPLchannels; ch._4_4_ = ch._4_4_ + 1) {
    pcVar1 = this->channels + ch._4_4_;
    if (pcVar1->channel == channel) {
      pcVar1->time = this->MLtime;
      pcVar1->pitch = pcVar1->finetune + iVar2;
      writeFrequency(this,ch._4_4_,(uint)pcVar1->realnote,pcVar1->pitch,1);
    }
  }
  return;
}

Assistant:

void musicBlock::OPLpitchWheel(uint channel, int pitch)
{
	uint i;
	uint id = channel;

	// Convert pitch from 14-bit to 7-bit, then scale it, since the player
	// code only understands sensitivities of 2 semitones.
	pitch = (pitch - 8192) * driverdata.channelPitchSens[channel] / (200 * 128) + 64;
	driverdata.channelPitch[channel] = pitch;
	for(i = 0; i < io->OPLchannels; i++)
	{
		struct channelEntry *ch = &channels[i];
		if (ch->channel == id)
		{
			ch->time = MLtime;
			ch->pitch = ch->finetune + pitch;
			writeFrequency(i, ch->realnote, ch->pitch, 1);
		}
	}
}